

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

bool __thiscall mocker::detail::MoveInfo::isMoveRelated(MoveInfo *this,Node *n)

{
  bool bVar1;
  mapped_type *pmVar2;
  __node_base *p_Var3;
  
  pmVar2 = std::__detail::
           _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->associatedMoves,n);
  p_Var3 = &(pmVar2->_M_h)._M_before_begin;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) break;
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>,std::shared_ptr<mocker::nasm::Mov>>
                      (&this->worklist,(shared_ptr<mocker::nasm::Mov> *)(p_Var3 + 1));
    if (bVar1) break;
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>,std::shared_ptr<mocker::nasm::Mov>>
                      (&this->active,(shared_ptr<mocker::nasm::Mov> *)(p_Var3 + 1));
  } while (!bVar1);
  return p_Var3 != (__node_base *)0x0;
}

Assistant:

bool MoveInfo::isMoveRelated(const Node &n) const {
  auto &movs = associatedMoves.at(n);
  for (auto &mov : movs) {
    if (isIn(worklist, mov))
      return true;
    if (isIn(active, mov))
      return true;
  }
  return false;
}